

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall module_overview_csv_actions::begin(module_overview_csv_actions *this)

{
  ostream *poVar1;
  
  if (s_csv_table_marker == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Overview]\n",0xb);
  }
  if (s_csv_table_header != '\0') {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Module",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
                      s_csv_separator_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Dependencies",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void begin()
    {
        if( s_csv_table_marker )
            std::cout << "[Overview]\n";
        if( s_csv_table_header )
            std::cout << "Module" << s_csv_separator << "Dependencies" << "\n";
    }